

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::builtins::StringAtoIMethod::eval
          (ConstantValue *__return_storage_ptr__,StringAtoIMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  pointer pcVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar2;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  optional<int> oVar5;
  int base;
  string_view str_00;
  string str;
  ConstantValue cv;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_70;
  uint local_68;
  undefined2 local_64;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  slang *local_58;
  long local_50 [2];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_40;
  
  base = param_3.startLoc._0_4_;
  Expression::eval((ConstantValue *)&local_40,*args->_M_ptr,context);
  if (local_40._M_index == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
  }
  else {
    pvVar3 = std::
             get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_40);
    pcVar1 = (pvVar3->_M_dataplus)._M_p;
    local_60._M_current = (char *)local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + pvVar3->_M_string_length);
    local_70.val._0_1_ = 0x5f;
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_58 + local_60._M_current),
                       (_Iter_equals_val<const_char>)&local_70);
    local_58 = (slang *)(_Var4._M_current + -(long)local_60._M_current);
    *_Var4._M_current = '\0';
    str_00._M_str = (char *)0x0;
    str_00._M_len = (size_t)local_60._M_current;
    oVar5 = strToInt(local_58,str_00,
                     (size_t *)(ulong)*(uint *)&(this->super_SimpleSystemSubroutine).field_0x64,base
                    );
    local_70.val = (long)oVar5.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_payload &
                   ((long)oVar5.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int> << 0x1f) >> 0x3f;
    local_68 = 0x20;
    local_64 = 1;
    SVInt::clearUnusedBits((SVInt *)&local_70);
    aVar2 = local_70;
    *(undefined8 *)
     &(__return_storage_ptr__->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = 0;
    *(uint *)((long)&(__return_storage_ptr__->value).
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             + 8) = local_68;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0xc) = (undefined1)local_64;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0xd) = local_64._1_1_;
    if (0x40 < local_68 || (local_64 & 0x100) != 0) {
      local_70.val = 0;
    }
    *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)
     &(__return_storage_ptr__->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = aVar2;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\x01';
    if ((0x40 < local_68 || (local_64 & 0x100) != 0) && ((void *)local_70.val != (void *)0x0)) {
      operator_delete__(local_70.pVal);
    }
    if ((long *)local_60._M_current != local_50) {
      operator_delete(local_60._M_current,local_50[0] + 1);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_40);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto cv = args[0]->eval(context);
        if (!cv)
            return nullptr;

        std::string str = cv.str();
        std::erase(str, '_');

        int result = strToInt(str, nullptr, base).value_or(0);
        return SVInt(32, uint64_t(result), true);
    }